

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O2

bool __thiscall
gui::MultilineTextBox::insertCharacter(MultilineTextBox *this,uint32_t unicode,bool suppressSignals)

{
  String *left;
  vector<sf::String,_std::allocator<sf::String>_> *pvVar1;
  Vector2<unsigned_long> *caretPosition;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  bool bVar6;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  pointer pSVar10;
  undefined7 in_register_00000011;
  ulong uVar11;
  wstring *this_00;
  String *pSVar12;
  long lVar13;
  long lStack_150;
  pair<sf::Vector2<unsigned_long>,_sf::Vector2<unsigned_long>_> selection;
  wstring local_108;
  undefined4 local_e4;
  size_t local_e0;
  unsigned_long local_d8;
  unsigned_long local_d0;
  vector<sf::String,_std::allocator<sf::String>_> lastBoxStrings;
  wstring local_98;
  Vector2<unsigned_long> lastCaretPosition;
  Vector2<unsigned_long> lastScroll;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_50
  ;
  
  if (this->readOnly_ != false) {
    return false;
  }
  lastBoxStrings.super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lastBoxStrings.super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lastBoxStrings.super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lastScroll.x = 0;
  lastScroll.y = 0;
  lastCaretPosition.x = 0;
  lastCaretPosition.y = 0;
  std::locale::locale((locale *)&local_108);
  sf::String::String((String *)&selection,".*",(locale *)&local_108);
  left = &this->regexPattern_;
  bVar6 = sf::operator!=(left,(String *)&selection);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&selection);
  std::locale::~locale((locale *)&local_108);
  if (bVar6) {
    std::vector<sf::String,_std::allocator<sf::String>_>::operator=
              (&lastBoxStrings,&this->boxStrings_);
    lastScroll.x = (this->scroll_).x;
    lastScroll.y = (this->scroll_).y;
    lastCaretPosition.x = (this->caretPosition_).x;
    lastCaretPosition.y = (this->caretPosition_).y;
  }
  local_e4 = (undefined4)CONCAT71(in_register_00000011,suppressSignals);
  if ((this->selectionStart_).second == true) {
    anon_unknown.dwarf_392173::sortByYFirst<unsigned_long>
              (&selection,&(this->selectionStart_).first,&this->selectionEnd_);
    local_d0 = selection.first.x;
    pvVar1 = &this->boxStrings_;
    local_d8 = selection.second.x;
    local_e0 = 0xffffffffffffffff;
    for (lVar13 = 0; uVar11 = lVar13 + selection.first.y, uVar11 <= selection.second.y;
        lVar13 = lVar13 + 1) {
      if (lVar13 == 0) {
        if (selection.first.y == selection.second.y) {
          sf::String::substring
                    ((String *)&local_98,
                     (pvVar1->super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                     super__Vector_impl_data._M_start + selection.first.y,0,local_d0);
          sf::String::substring
                    ((String *)&local_50,
                     (pvVar1->super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                     super__Vector_impl_data._M_start + selection.first.y,local_d8,local_e0);
          sf::operator+((String *)&local_108,(String *)&local_98,(String *)&local_50);
          sf::String::operator=
                    ((pvVar1->super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                     super__Vector_impl_data._M_start + selection.first.y,(String *)&local_108);
          std::__cxx11::
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&local_108);
          std::__cxx11::
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~basic_string(&local_50);
          this_00 = &local_98;
        }
        else {
          sf::String::substring
                    ((String *)&local_108,
                     (pvVar1->super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                     super__Vector_impl_data._M_start + selection.first.y,0,local_d0);
          sf::String::operator=
                    ((pvVar1->super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                     super__Vector_impl_data._M_start + selection.first.y,(String *)&local_108);
          this_00 = &local_108;
        }
        std::__cxx11::
        basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
        ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)this_00);
      }
      else if (uVar11 < selection.second.y && selection.first.y < uVar11) {
        std::vector<sf::String,_std::allocator<sf::String>_>::erase
                  (pvVar1,(pvVar1->super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                          _M_impl.super__Vector_impl_data._M_start + selection.first.y + 1);
      }
      else if ((selection.first.y - selection.second.y) + lVar13 == 0) {
        sf::String::substring
                  ((String *)&local_108,
                   (pvVar1->super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                   super__Vector_impl_data._M_start + selection.first.y + 1,local_d8,local_e0);
        sf::String::operator+=
                  ((pvVar1->super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                   super__Vector_impl_data._M_start + selection.first.y,(String *)&local_108);
        std::__cxx11::
        basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
        ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&local_108);
        std::vector<sf::String,_std::allocator<sf::String>_>::erase
                  (pvVar1,(pvVar1->super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                          _M_impl.super__Vector_impl_data._M_start + selection.first.y + 1);
      }
    }
    uVar2 = (this->selectionStart_).first.x;
    uVar3 = (this->selectionStart_).first.y;
    uVar4 = (this->selectionEnd_).x;
    uVar5 = (this->selectionEnd_).y;
    updateCaretPosition(this,&selection.first,false);
    bVar6 = uVar3 != uVar5 || uVar2 != uVar4;
  }
  else {
    bVar6 = false;
  }
  caretPosition = &this->caretPosition_;
  sVar8 = findCaretOffset(this,caretPosition);
  if (unicode == 8) {
    if ((sVar8 == 0) || (bVar6 != false)) goto LAB_0018219f;
    uVar2 = (this->caretPosition_).x;
    pSVar12 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
              _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
    if (uVar2 == 0) {
      sf::String::operator+=(pSVar12 + -1,pSVar12);
      std::vector<sf::String,_std::allocator<sf::String>_>::erase
                (&this->boxStrings_,
                 (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y);
    }
    else {
      sf::String::erase(pSVar12,uVar2 - 1,1);
    }
    uVar2 = (this->scroll_).x;
    lStack_150 = -1;
    if ((uVar2 != 0) &&
       (uVar3 = (this->sizeCharacters_).x,
       sVar9 = anon_unknown.dwarf_392173::findLongestLength(&this->boxStrings_), lStack_150 = -1,
       sVar9 < uVar3 + uVar2)) {
      (this->scroll_).x = (this->scroll_).x - 1;
    }
  }
  else {
    if (unicode == 9) {
      for (uVar11 = caretPosition->x | 0xfffffffffffffffc; uVar11 != 0; uVar11 = uVar11 + 1) {
        bVar7 = insertCharacter(this,0x20,true);
        if (bVar7) {
          bVar6 = true;
        }
      }
      goto LAB_0018219f;
    }
    if (unicode == 0x7f) {
      if (bVar6 == false) {
        pvVar1 = &this->boxStrings_;
        sVar9 = anon_unknown.dwarf_392173::findStringsLength(pvVar1);
        if (sVar8 < sVar9) {
          sVar8 = (this->caretPosition_).x;
          sVar9 = sf::String::getSize((this->boxStrings_).
                                      super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                                      (this->caretPosition_).y);
          pSVar12 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                    _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
          if (sVar8 == sVar9) {
            sf::String::operator+=(pSVar12,pSVar12 + 1);
            std::vector<sf::String,_std::allocator<sf::String>_>::erase
                      (pvVar1,(this->boxStrings_).
                              super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                              super__Vector_impl_data._M_start + (this->caretPosition_).y + 1);
          }
          else {
            sf::String::erase(pSVar12,caretPosition->x,1);
          }
          uVar2 = (this->scroll_).x;
          if ((uVar2 != 0) &&
             (uVar3 = (this->sizeCharacters_).x,
             sVar8 = anon_unknown.dwarf_392173::findLongestLength(pvVar1), sVar8 < uVar3 + uVar2)) {
            (this->scroll_).x = (this->scroll_).x - 1;
          }
          bVar6 = true;
          updateCaretPosition(this,caretPosition,false);
        }
      }
      goto LAB_0018219f;
    }
    if (unicode == 10) {
      if ((this->maxCharacters_ != 0) &&
         (sVar9 = anon_unknown.dwarf_392173::findStringsLength(&this->boxStrings_),
         this->maxCharacters_ <= sVar9)) goto LAB_0018219f;
      if (this->maxLines_ == 0) {
        pSVar10 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        pSVar10 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (this->maxLines_ <=
            (ulong)((long)(this->boxStrings_).
                          super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pSVar10 >> 5))
        goto LAB_0018219f;
      }
      uVar2 = (this->caretPosition_).y;
      sf::String::substring
                ((String *)&selection,pSVar10 + uVar2,(this->caretPosition_).x,0xffffffffffffffff);
      std::vector<sf::String,_std::allocator<sf::String>_>::_M_insert_rval
                (&this->boxStrings_,pSVar10 + uVar2 + 1,(value_type *)&selection);
      std::__cxx11::
      basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
      ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&selection);
      sf::String::substring
                ((String *)&selection,
                 (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y,0,
                 (this->caretPosition_).x);
      sf::String::operator=
                ((this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y,
                 (String *)&selection);
    }
    else {
      if ((this->maxCharacters_ != 0) &&
         (sVar9 = anon_unknown.dwarf_392173::findStringsLength(&this->boxStrings_),
         this->maxCharacters_ <= sVar9)) goto LAB_0018219f;
      uVar2 = (this->caretPosition_).y;
      pSVar10 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start;
      sVar9 = (this->caretPosition_).x;
      sf::String::String((String *)&selection,unicode);
      sf::String::insert(pSVar10 + uVar2,sVar9,(String *)&selection);
    }
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&selection);
    lStack_150 = 1;
  }
  bVar6 = true;
  updateCaretPosition(this,sVar8 + lStack_150,false);
LAB_0018219f:
  std::locale::locale((locale *)&local_108);
  sf::String::String((String *)&selection,".*",(locale *)&local_108);
  bVar7 = sf::operator!=(left,(String *)&selection);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&selection);
  std::locale::~locale((locale *)&local_108);
  if (bVar7) {
    sf::String::toWideString_abi_cxx11_(&local_108,left);
    std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
    basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
              ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&selection,&local_108,
               0x10);
    std::__cxx11::wstring::~wstring((wstring *)&local_108);
    anon_unknown.dwarf_392173::combineStrings((String *)&local_98,&this->boxStrings_);
    sf::String::toWideString_abi_cxx11_(&local_108,(String *)&local_98);
    bVar7 = std::
            regex_match<std::char_traits<wchar_t>,std::allocator<wchar_t>,wchar_t,std::__cxx11::regex_traits<wchar_t>>
                      (&local_108,
                       (basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)&selection,0);
    std::__cxx11::wstring::~wstring((wstring *)&local_108);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&local_98);
    if (!bVar7) {
      std::vector<sf::String,_std::allocator<sf::String>_>::operator=
                (&this->boxStrings_,&lastBoxStrings);
      (this->scroll_).x = lastScroll.x;
      (this->scroll_).y = lastScroll.y;
      bVar6 = false;
      updateCaretPosition(this,&lastCaretPosition,false);
    }
    std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
              ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)&selection);
  }
  if (((~bVar6 | (byte)local_e4) & 1) == 0) {
    sVar8 = anon_unknown.dwarf_392173::findStringsLength(&this->boxStrings_);
    Signal<gui::Widget_*,_unsigned_long>::emit(&this->onTextChange,&this->super_Widget,sVar8);
  }
  std::vector<sf::String,_std::allocator<sf::String>_>::~vector(&lastBoxStrings);
  return bVar6;
}

Assistant:

bool MultilineTextBox::insertCharacter(uint32_t unicode, bool suppressSignals) {
    if (readOnly_) {
        return false;
    }
    // For a regex pattern, first backup the state that we need to restore if the pattern match fails.
    std::vector<sf::String> lastBoxStrings;
    sf::Vector2<size_t> lastScroll, lastCaretPosition;
    if (regexPattern_ != ".*") {
        lastBoxStrings = boxStrings_;
        lastScroll = scroll_;
        lastCaretPosition = caretPosition_;
    }

    // Check if the selection will be replaced.
    bool textChanged = false, clearedSelection = false;
    if (selectionStart_.second) {
        auto selection = sortByYFirst(selectionStart_.first, selectionEnd_);
        for (size_t y = selection.first.y; y <= selection.second.y; ++y) {
            if (y == selection.first.y) {
                if (y == selection.second.y) {
                    boxStrings_[y] = boxStrings_[y].substring(0, selection.first.x) + boxStrings_[y].substring(selection.second.x);
                } else {
                    boxStrings_[y] = boxStrings_[y].substring(0, selection.first.x);
                }
            } else if (y > selection.first.y && y < selection.second.y) {
                boxStrings_.erase(boxStrings_.begin() + selection.first.y + 1);
            } else if (y == selection.second.y) {
                boxStrings_[selection.first.y] += boxStrings_[selection.first.y + 1].substring(selection.second.x);
                boxStrings_.erase(boxStrings_.begin() + selection.first.y + 1);
            }
        }
        if (selectionStart_.first != selectionEnd_) {
            textChanged = true;
            clearedSelection = true;
        }
        updateCaretPosition(selection.first, false);
    }
    size_t caretOffset = findCaretOffset(caretPosition_);

    if (unicode == '\u000a') {    // Enter key.
        if ((maxCharacters_ == 0 || findStringsLength(boxStrings_) < maxCharacters_) && (maxLines_ == 0 || boxStrings_.size() < maxLines_)) {
            boxStrings_.emplace(boxStrings_.begin() + caretPosition_.y + 1, boxStrings_[caretPosition_.y].substring(caretPosition_.x));
            boxStrings_[caretPosition_.y] = boxStrings_[caretPosition_.y].substring(0, caretPosition_.x);
            updateCaretPosition(caretOffset + 1, false);
            textChanged = true;
        }
    } else if (unicode == '\u0008') {    // Backspace key.
        if (!clearedSelection && caretOffset > 0) {
            if (caretPosition_.x == 0) {
                boxStrings_[caretPosition_.y - 1] += boxStrings_[caretPosition_.y];
                boxStrings_.erase(boxStrings_.begin() + caretPosition_.y);
            } else {
                boxStrings_[caretPosition_.y].erase(caretPosition_.x - 1, 1);
            }
            if (scroll_.x > 0 && scroll_.x + sizeCharacters_.x > findLongestLength(boxStrings_)) {
                --scroll_.x;
            }
            updateCaretPosition(caretOffset - 1, false);
            textChanged = true;
        }
    } else if (unicode == '\u0009') {    // Tab key.
        size_t count = 4 - caretPosition_.x % 4;
        for (size_t i = 0; i < count; ++i) {
            textChanged = insertCharacter(' ', true) || textChanged;
        }
    } else if (unicode == '\u007f') {    // Delete key.
        if (!clearedSelection && caretOffset < findStringsLength(boxStrings_)) {
            if (caretPosition_.x == boxStrings_[caretPosition_.y].getSize()) {
                boxStrings_[caretPosition_.y] += boxStrings_[caretPosition_.y + 1];
                boxStrings_.erase(boxStrings_.begin() + caretPosition_.y + 1);
            } else {
                boxStrings_[caretPosition_.y].erase(caretPosition_.x, 1);
            }
            if (scroll_.x > 0 && scroll_.x + sizeCharacters_.x > findLongestLength(boxStrings_)) {
                --scroll_.x;
            }
            updateCaretPosition(caretPosition_, false);
            textChanged = true;
        }
    } else {    // Printable character.
        if (maxCharacters_ == 0 || findStringsLength(boxStrings_) < maxCharacters_) {
            boxStrings_[caretPosition_.y].insert(caretPosition_.x, sf::String(unicode));
            updateCaretPosition(caretOffset + 1, false);
            textChanged = true;
        }
    }

    if (regexPattern_ != ".*") {
        std::wregex regex(regexPattern_.toWideString());
        if (!std::regex_match(combineStrings(boxStrings_).toWideString(), regex)) {
            GUI_DEBUG << "Regex pattern match failed, discarding character input.\n";
            boxStrings_ = lastBoxStrings;
            scroll_ = lastScroll;
            updateCaretPosition(lastCaretPosition, false);
            textChanged = false;
        }
    }

    if (textChanged && !suppressSignals) {
        onTextChange.emit(this, findStringsLength(boxStrings_));
    }
    return textChanged;
}